

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_flow_scalar(yaml_parser_t *parser,int single)

{
  size_t *psVar1;
  yaml_token_t **tail;
  yaml_char_t yVar2;
  yaml_char_t *pyVar3;
  size_t sVar4;
  bool bVar5;
  undefined1 *puVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  byte *pbVar12;
  size_t sVar13;
  char *pcVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  byte *pbVar18;
  size_t sVar19;
  yaml_token_t *pyVar20;
  undefined1 __s [8];
  yaml_token_t *pyVar21;
  long lVar22;
  ulong length;
  bool bVar23;
  yaml_char_t **ppyVar24;
  byte bVar25;
  yaml_mark_t start_mark;
  undefined1 (*local_128) [16];
  undefined1 (*pauStack_120) [16];
  undefined1 (*apauStack_118 [2]) [16];
  undefined1 local_108 [8];
  undefined1 (*pauStack_100) [16];
  yaml_char_t *local_f8 [2];
  undefined1 local_e8 [8];
  undefined1 (*pauStack_e0) [16];
  undefined1 (*local_d8 [2]) [16];
  undefined1 local_c8 [8];
  undefined1 (*pauStack_c0) [16];
  undefined1 (*local_b8) [16];
  yaml_mark_t *local_b0;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  uint local_8c;
  yaml_token_t local_88;
  
  bVar25 = 0;
  iVar8 = yaml_parser_save_simple_key(parser);
  if (iVar8 != 0) {
    parser->simple_key_allowed = 0;
    pauStack_120 = (undefined1 (*) [16])0x0;
    apauStack_118[0] = (undefined1 (*) [16])0x0;
    local_d8[0] = (undefined1 (*) [16])0x0;
    _local_e8 = (undefined1  [16])0x0;
    local_f8[0] = (yaml_char_t *)0x0;
    _local_108 = (undefined1  [16])0x0;
    local_b8 = (undefined1 (*) [16])0x0;
    _local_c8 = (undefined1  [16])0x0;
    local_128 = (undefined1 (*) [16])yaml_malloc(0x10);
    if (local_128 != (undefined1 (*) [16])0x0) {
      pauStack_120 = local_128 + 1;
      *local_128 = (undefined1  [16])0x0;
      apauStack_118[0] = local_128;
      pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_e8 = (undefined1  [8])pauVar10;
      if (pauVar10 != (undefined1 (*) [16])0x0) {
        pauStack_e0 = pauVar10 + 1;
        *pauVar10 = (undefined1  [16])0x0;
        local_d8[0] = pauVar10;
        pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
        local_108 = (undefined1  [8])pauVar10;
        if (pauVar10 != (undefined1 (*) [16])0x0) {
          pauStack_100 = pauVar10 + 1;
          *pauVar10 = (undefined1  [16])0x0;
          local_f8[0] = (yaml_char_t *)pauVar10;
          pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
          local_c8 = (undefined1  [8])pauVar10;
          if (pauVar10 != (undefined1 (*) [16])0x0) {
            local_b8 = pauVar10;
            pauStack_c0 = pauVar10 + 1;
            *pauVar10 = (undefined1  [16])0x0;
            local_98 = (parser->mark).column;
            sStack_a0 = (parser->mark).line;
            local_a8 = (parser->mark).index;
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            pbVar18 = (parser->buffer).pointer;
            uVar11 = parser->unread - 1;
            parser->unread = uVar11;
            bVar15 = *pbVar18;
            lVar17 = 1;
            if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
               (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
              lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
            }
            local_b0 = &parser->mark;
            (parser->buffer).pointer = pbVar18 + lVar17;
            local_8c = (uint)(single != 0) * 5 + 0x22;
LAB_0011288b:
            if ((3 < uVar11) || (iVar8 = yaml_parser_update_buffer(parser,4), iVar8 != 0)) {
              pyVar3 = (parser->buffer).pointer;
              yVar2 = *pyVar3;
              if ((parser->mark).column == 0) {
                if (yVar2 == '-') {
                  if ((pyVar3[1] != '-') || (pyVar3[2] != '-')) goto LAB_001128c2;
                }
                else {
                  if (yVar2 != '.') goto LAB_001128ba;
                  if ((pyVar3[1] != '.') || (pyVar3[2] != '.')) goto LAB_001128c2;
                }
                bVar15 = pyVar3[3];
                if (bVar15 == 0xc2) {
                  if (pyVar3[4] != 0x85) goto LAB_001128c2;
                }
                else if (((bVar15 == 0xe2) || (0x20 < bVar15)) ||
                        ((0x100002601U >> ((ulong)(uint)bVar15 & 0x3f) & 1) == 0)) {
LAB_001128c2:
                  uVar11 = parser->unread;
joined_r0x001128ca:
                  if ((uVar11 < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
                  goto LAB_00113ada;
                  pbVar18 = (parser->buffer).pointer;
                  bVar15 = *pbVar18;
                  if (bVar15 == 0xc2) {
                    if (pbVar18[1] == 0x85) goto LAB_00113223;
                  }
                  else if (((bVar15 != 0xe2) && (bVar15 < 0x21)) &&
                          ((0x100002601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) goto LAB_00113223;
                  if (single != 0) {
                    bVar16 = 0x27;
                    if ((bVar15 != 0x27) || (pbVar18[1] != 0x27)) goto LAB_00112b06;
                    if (((undefined1 (*) [16])(*apauStack_118[0] + 5) < pauStack_120) ||
                       (iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                   (yaml_char_t **)apauStack_118,
                                                   (yaml_char_t **)&pauStack_120), iVar8 != 0))
                    goto LAB_001129e9;
                    goto LAB_00113ad4;
                  }
                  bVar16 = 0x22;
LAB_00112b06:
                  if (bVar16 == bVar15) goto LAB_00113223;
                  if (bVar15 == 0x5c && single == 0) {
                    bVar15 = pbVar18[1];
                    if (bVar15 < 0xe2) {
                      if (bVar15 == 0xc2) {
                        if (pbVar18[2] == 0x85) {
LAB_00113271:
                          uVar11 = parser->unread;
                          pbVar12 = pbVar18;
                          if (uVar11 < 3) {
                            iVar8 = yaml_parser_update_buffer(parser,3);
                            if (iVar8 == 0) goto LAB_00113ada;
                            pbVar12 = (parser->buffer).pointer;
                            uVar11 = parser->unread;
                          }
                          sVar19 = (parser->mark).index;
                          (parser->mark).index = sVar19 + 1;
                          psVar1 = &(parser->mark).column;
                          *psVar1 = *psVar1 + 1;
                          sVar13 = uVar11 - 1;
                          parser->unread = sVar13;
                          bVar15 = *pbVar12;
                          lVar17 = 1;
                          if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                             (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
                            lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                          }
                          pbVar18 = pbVar12 + lVar17;
                          (parser->buffer).pointer = pbVar18;
                          bVar15 = pbVar12[lVar17];
                          bVar23 = true;
                          if (bVar15 < 0xc2) {
                            if (bVar15 == 10) goto LAB_0011339e;
                            if (bVar15 != 0xd) goto LAB_0011322d;
                            if (pbVar18[1] != 10) goto LAB_0011339e;
                            (parser->mark).index = sVar19 + 3;
                            (parser->mark).column = 0;
                            psVar1 = &(parser->mark).line;
                            *psVar1 = *psVar1 + 1;
                            sVar13 = uVar11 - 3;
                            parser->unread = sVar13;
                            pbVar18 = pbVar18 + 2;
                          }
                          else {
                            if ((bVar15 != 0xc2) || (pbVar18[1] != 0x85)) goto LAB_0011322d;
LAB_0011339e:
                            (parser->mark).index = sVar19 + 2;
                            (parser->mark).column = 0;
                            psVar1 = &(parser->mark).line;
                            *psVar1 = *psVar1 + 1;
                            sVar13 = uVar11 - 2;
                            parser->unread = sVar13;
                            bVar15 = *pbVar18;
                            lVar17 = 1;
                            if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                               (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
                              lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                            }
                            pbVar18 = pbVar18 + lVar17;
                          }
                          (parser->buffer).pointer = pbVar18;
                          goto LAB_0011322d;
                        }
                      }
                      else if ((bVar15 == 10) || (bVar15 == 0xd)) goto LAB_00113271;
                    }
                    if (pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) {
                      iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                 (yaml_char_t **)apauStack_118,
                                                 (yaml_char_t **)&pauStack_120);
                      if (iVar8 == 0) goto LAB_00113ad4;
                      bVar15 = (parser->buffer).pointer[1];
                    }
                    bVar23 = true;
                    if (bVar15 < 0x5c) {
                      if (bVar15 < 0x2f) {
                        if (bVar15 == 9) goto switchD_00112ceb_caseD_74;
                        if (bVar15 == 0x20) {
                          (*apauStack_118[0])[0] = 0x20;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                        else {
                          if (bVar15 != 0x22) goto switchD_00112ceb_caseD_5d;
                          (*apauStack_118[0])[0] = 0x22;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                      }
                      else {
                        switch(bVar15) {
                        case 0x4c:
                          (*apauStack_118[0])[0] = 0xe2;
                          puVar6 = *apauStack_118[0];
                          (*apauStack_118[0])[1] = 0x80;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 3);
                          puVar6[2] = 0xa8;
                          break;
                        case 0x4d:
                        case 0x4f:
                        case 0x51:
                        case 0x52:
                        case 0x53:
                        case 0x54:
switchD_00112ceb_caseD_5d:
                          parser->error = YAML_SCANNER_ERROR;
                          parser->context = "while parsing a quoted scalar";
                          (parser->context_mark).index = local_a8;
                          (parser->context_mark).line = sStack_a0;
                          (parser->context_mark).column = local_98;
                          pcVar14 = "found unknown escape character";
                          goto LAB_00113b64;
                        case 0x4e:
                          puVar6 = *apauStack_118[0];
                          (*apauStack_118[0])[0] = 0xc2;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                          puVar6[1] = 0x85;
                          break;
                        case 0x50:
                          (*apauStack_118[0])[0] = 0xe2;
                          puVar6 = *apauStack_118[0];
                          (*apauStack_118[0])[1] = 0x80;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 3);
                          puVar6[2] = 0xa9;
                          break;
                        case 0x55:
                          length = 8;
                          goto LAB_00112efb;
                        default:
                          if (bVar15 == 0x2f) {
                            (*apauStack_118[0])[0] = 0x2f;
                            apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                          }
                          else {
                            if (bVar15 != 0x30) goto switchD_00112ceb_caseD_5d;
                            (*apauStack_118[0])[0] = 0;
                            apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                          }
                        }
                      }
                    }
                    else {
                      switch(bVar15) {
                      case 0x5c:
                        (*apauStack_118[0])[0] = 0x5c;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      default:
                        goto switchD_00112ceb_caseD_5d;
                      case 0x5f:
                        (*apauStack_118[0])[0] = 0xc2;
                        (*apauStack_118[0])[1] = 0xa0;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                        break;
                      case 0x61:
                        (*apauStack_118[0])[0] = 7;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x62:
                        (*apauStack_118[0])[0] = 8;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x65:
                        (*apauStack_118[0])[0] = 0x1b;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x66:
                        (*apauStack_118[0])[0] = 0xc;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x6e:
                        (*apauStack_118[0])[0] = 10;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x72:
                        (*apauStack_118[0])[0] = 0xd;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x74:
switchD_00112ceb_caseD_74:
                        (*apauStack_118[0])[0] = 9;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x75:
                        length = 4;
                        goto LAB_00112efb;
                      case 0x76:
                        (*apauStack_118[0])[0] = 0xb;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        break;
                      case 0x78:
                        length = 2;
LAB_00112efb:
                        bVar5 = false;
                        goto LAB_00112f18;
                      }
                    }
                    bVar5 = true;
                    bVar23 = false;
                    length = 0;
LAB_00112f18:
                    sVar13 = (parser->mark).index;
                    (parser->mark).index = sVar13 + 1;
                    sVar19 = (parser->mark).column;
                    (parser->mark).column = sVar19 + 1;
                    pbVar18 = (parser->buffer).pointer;
                    sVar4 = parser->unread;
                    parser->unread = sVar4 - 1;
                    bVar15 = *pbVar18;
                    lVar17 = 1;
                    lVar22 = 1;
                    if ((((char)bVar15 < '\0') && (lVar22 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                       (lVar22 = 3, (bVar15 & 0xf0) != 0xe0)) {
                      lVar22 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                    }
                    (parser->buffer).pointer = pbVar18 + lVar22;
                    (parser->mark).index = sVar13 + 2;
                    (parser->mark).column = sVar19 + 2;
                    uVar11 = sVar4 - 2;
                    parser->unread = uVar11;
                    bVar15 = pbVar18[lVar22];
                    if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                       (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
                      lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                    }
                    (parser->buffer).pointer = pbVar18 + lVar22 + lVar17;
                    if (!bVar5) {
                      if ((uVar11 < length) &&
                         (iVar8 = yaml_parser_update_buffer(parser,length), iVar8 == 0))
                      goto LAB_00113ada;
                      uVar9 = 0;
                      if (bVar23) {
                        lVar17 = 0;
                        uVar9 = 0;
                        do {
                          bVar15 = (parser->buffer).pointer[lVar17];
                          iVar8 = -0x30;
                          if (((9 < (byte)(bVar15 - 0x30)) &&
                              (iVar8 = -0x37, 5 < (byte)(bVar15 + 0xbf))) &&
                             (iVar8 = -0x57, 5 < (byte)(bVar15 + 0x9f))) {
                            parser->error = YAML_SCANNER_ERROR;
                            parser->context = "while parsing a quoted scalar";
                            (parser->context_mark).index = local_a8;
                            (parser->context_mark).line = sStack_a0;
                            (parser->context_mark).column = local_98;
                            pcVar14 = "did not find expected hexdecimal number";
                            goto LAB_00113b64;
                          }
                          uVar9 = uVar9 * 0x10 + iVar8 + (uint)bVar15;
                          lVar17 = lVar17 + 1;
                        } while (length + (length == 0) != lVar17);
                        if ((0x10ffff < uVar9) || ((uVar9 & 0xfffff800) == 0xd800)) {
                          parser->error = YAML_SCANNER_ERROR;
                          parser->context = "while parsing a quoted scalar";
                          (parser->context_mark).index = local_a8;
                          (parser->context_mark).line = sStack_a0;
                          (parser->context_mark).column = local_98;
                          pcVar14 = "found invalid Unicode character escape code";
                          goto LAB_00113b64;
                        }
                        if (0x7f < uVar9) {
                          if (uVar9 < 0x800) {
                            bVar15 = (byte)(uVar9 >> 6) | 0xc0;
                          }
                          else {
                            puVar6 = *apauStack_118[0];
                            if (uVar9 < 0x10000) {
                              (*apauStack_118[0])[0] = (byte)(uVar9 >> 0xc) | 0xe0;
                              apauStack_118[0] = (undefined1 (*) [16])(puVar6 + 1);
                            }
                            else {
                              (*apauStack_118[0])[0] = (byte)(uVar9 >> 0x12) | 0xf0;
                              apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                              (*(undefined1 (*) [16])(puVar6 + 1))[0] =
                                   (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
                            }
                            bVar15 = (byte)(uVar9 >> 6) & 0x3f | 0x80;
                          }
                          (*apauStack_118[0])[0] = bVar15;
                          uVar9 = (uint)((byte)uVar9 & 0x3f | 0x80);
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                      }
                      puVar6 = *apauStack_118[0];
                      (*apauStack_118[0])[0] = (char)uVar9;
                      uVar11 = parser->unread;
                      apauStack_118[0] = (undefined1 (*) [16])(puVar6 + 1);
                      if (bVar23) {
                        pbVar18 = (parser->buffer).pointer;
                        sVar13 = (parser->mark).index;
                        sVar19 = (parser->mark).column;
                        lVar17 = length + (length == 0);
                        do {
                          sVar19 = sVar19 + 1;
                          sVar13 = sVar13 + 1;
                          (parser->mark).index = sVar13;
                          (parser->mark).column = sVar19;
                          uVar11 = uVar11 - 1;
                          parser->unread = uVar11;
                          bVar15 = *pbVar18;
                          lVar22 = 1;
                          if ((((char)bVar15 < '\0') && (lVar22 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                             (lVar22 = 3, (bVar15 & 0xf0) != 0xe0)) {
                            lVar22 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                          }
                          pbVar18 = pbVar18 + lVar22;
                          (parser->buffer).pointer = pbVar18;
                          lVar17 = lVar17 + -1;
                        } while (lVar17 != 0);
                      }
                    }
                  }
                  else {
                    if (pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) {
                      iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                 (yaml_char_t **)apauStack_118,
                                                 (yaml_char_t **)&pauStack_120);
                      if (iVar8 == 0) goto LAB_00113ad4;
                      pbVar18 = (parser->buffer).pointer;
                      bVar15 = *pbVar18;
                    }
                    if ((char)bVar15 < '\0') {
                      if ((bVar15 & 0xe0) == 0xc0) {
LAB_00112bfd:
                        (parser->buffer).pointer = pbVar18 + 1;
                        (*apauStack_118[0])[0] = *pbVar18;
                        pbVar18 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_00112c21;
                      }
                      if ((bVar15 & 0xf0) == 0xe0) {
LAB_00112bd9:
                        (parser->buffer).pointer = pbVar18 + 1;
                        (*apauStack_118[0])[0] = *pbVar18;
                        pbVar18 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_00112bfd;
                      }
                      if ((bVar15 & 0xf8) == 0xf0) {
                        (parser->buffer).pointer = pbVar18 + 1;
                        (*apauStack_118[0])[0] = *pbVar18;
                        pbVar18 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_00112bd9;
                      }
                    }
                    else {
LAB_00112c21:
                      (parser->buffer).pointer = pbVar18 + 1;
                      (*apauStack_118[0])[0] = *pbVar18;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                    }
                    (parser->mark).index = (parser->mark).index + 1;
                    psVar1 = &(parser->mark).column;
                    *psVar1 = *psVar1 + 1;
                    uVar11 = parser->unread - 1;
                    parser->unread = uVar11;
                  }
                  goto joined_r0x001128ca;
                }
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                (parser->context_mark).index = local_a8;
                (parser->context_mark).line = sStack_a0;
                (parser->context_mark).column = local_98;
                pcVar14 = "found unexpected document indicator";
              }
              else {
LAB_001128ba:
                if (yVar2 != '\0') goto LAB_001128c2;
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                (parser->context_mark).index = local_a8;
                (parser->context_mark).line = sStack_a0;
                (parser->context_mark).column = local_98;
                pcVar14 = "found unexpected end of stream";
              }
LAB_00113b64:
              parser->problem = pcVar14;
              sVar13 = local_b0->line;
              (parser->problem_mark).index = local_b0->index;
              (parser->problem_mark).line = sVar13;
              (parser->problem_mark).column = local_b0->column;
            }
            goto LAB_00113ada;
          }
        }
      }
    }
LAB_00113ad4:
    parser->error = YAML_MEMORY_ERROR;
LAB_00113ada:
    yaml_free(local_128);
    apauStack_118[0] = (undefined1 (*) [16])0x0;
    local_128 = (undefined1 (*) [16])0x0;
    pauStack_120 = (undefined1 (*) [16])0x0;
    yaml_free((void *)local_e8);
    local_d8[0] = (undefined1 (*) [16])0x0;
    _local_e8 = (undefined1  [16])0x0;
    yaml_free((void *)local_108);
    local_f8[0] = (yaml_char_t *)0x0;
    _local_108 = (undefined1  [16])0x0;
    yaml_free((void *)local_c8);
  }
  return 0;
LAB_001129e9:
  (*apauStack_118[0])[0] = 0x27;
  sVar13 = (parser->mark).index;
  (parser->mark).index = sVar13 + 1;
  sVar19 = (parser->mark).column;
  (parser->mark).column = sVar19 + 1;
  pbVar18 = (parser->buffer).pointer;
  sVar4 = parser->unread;
  parser->unread = sVar4 - 1;
  bVar15 = *pbVar18;
  lVar17 = 1;
  lVar22 = 1;
  if ((((char)bVar15 < '\0') && (lVar22 = 2, (bVar15 & 0xe0) != 0xc0)) &&
     (lVar22 = 3, (bVar15 & 0xf0) != 0xe0)) {
    lVar22 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar18 + lVar22;
  (parser->mark).index = sVar13 + 2;
  (parser->mark).column = sVar19 + 2;
  uVar11 = sVar4 - 2;
  parser->unread = uVar11;
  bVar15 = pbVar18[lVar22];
  if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
     (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
    lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar18 + lVar22 + lVar17;
  apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
  goto joined_r0x001128ca;
LAB_00113223:
  sVar13 = parser->unread;
  bVar23 = false;
LAB_0011322d:
  if (sVar13 == 0) {
    iVar8 = yaml_parser_update_buffer(parser,1);
    if (iVar8 == 0) goto LAB_00113ada;
    pbVar18 = (parser->buffer).pointer;
  }
  if (local_8c == *pbVar18) {
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    parser->unread = parser->unread - 1;
    bVar15 = *pbVar18;
    lVar17 = 1;
    if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
       (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
      lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar18 + lVar17;
    local_88.end_mark.column = local_b0->column;
    local_88.end_mark.index = local_b0->index;
    local_88.end_mark.line = local_b0->line;
    local_88.type = YAML_SCALAR_TOKEN;
    local_88._4_4_ = 0;
    local_88.start_mark.index = local_a8;
    local_88.start_mark.line = sStack_a0;
    local_88.start_mark.column = local_98;
    local_88.data.tag.handle = (yaml_char_t *)local_128;
    local_88.data.tag.suffix = (yaml_char_t *)((long)apauStack_118[0] - (long)local_128);
    local_88.data._20_4_ = 0;
    local_88.data.scalar.style = (single == 0) + 2;
    yaml_free((void *)local_e8);
    local_d8[0] = (undefined1 (*) [16])0x0;
    _local_e8 = (undefined1  [16])0x0;
    yaml_free((void *)local_108);
    local_f8[0] = (yaml_char_t *)0x0;
    _local_108 = (undefined1  [16])0x0;
    yaml_free((void *)local_c8);
    tail = &(parser->tokens).tail;
    pyVar21 = (parser->tokens).tail;
    if (pyVar21 == (parser->tokens).end) {
      iVar8 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                &(parser->tokens).end);
      if (iVar8 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_token_delete(&local_88);
        return 0;
      }
      pyVar21 = *tail;
    }
    *tail = pyVar21 + 1;
    pyVar20 = &local_88;
    for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar7 = *(undefined4 *)&pyVar20->field_0x4;
      pyVar21->type = pyVar20->type;
      *(undefined4 *)&pyVar21->field_0x4 = uVar7;
      pyVar20 = (yaml_token_t *)((long)pyVar20 + ((ulong)bVar25 * -2 + 1) * 8);
      pyVar21 = (yaml_token_t *)((long)pyVar21 + (ulong)bVar25 * -0x10 + 8);
    }
    return 1;
  }
  sVar13 = parser->unread;
joined_r0x00113266:
  if ((sVar13 == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0)) goto LAB_00113ada;
  pbVar18 = (parser->buffer).pointer;
  bVar15 = *pbVar18;
  if (bVar15 < 0x20) {
    if (bVar15 == 9) goto LAB_00113485;
    if ((bVar15 != 10) && (bVar15 != 0xd)) goto LAB_00113964;
LAB_00113511:
    if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
    goto LAB_00113ada;
    if (bVar23) {
      if ((local_f8[0] + 5 < pauStack_100) ||
         (iVar8 = yaml_string_extend((yaml_char_t **)local_108,local_f8,
                                     (yaml_char_t **)(local_108 + 8)), iVar8 != 0)) {
        pauVar10 = (undefined1 (*) [16])local_f8[0];
        pbVar18 = (parser->buffer).pointer;
        bVar15 = *pbVar18;
        if (bVar15 < 0xc2) {
          if (bVar15 != 10) {
            if (bVar15 != 0xd) goto LAB_001134ee;
            if (pbVar18[1] == 10) {
              local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
              goto LAB_0011362b;
            }
          }
          local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
LAB_001138ed:
          (*pauVar10)[0] = 10;
          ppyVar24 = &(parser->buffer).pointer;
          *ppyVar24 = *ppyVar24 + 1;
          goto LAB_0011391c;
        }
        if ((bVar15 == 0xc2) && (pbVar18[1] == 0x85)) {
          local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
          goto LAB_00113911;
        }
        goto LAB_001134ee;
      }
      goto LAB_00113ad4;
    }
    local_b8 = (undefined1 (*) [16])local_c8;
    memset((void *)local_c8,0,(long)pauStack_c0 - (long)local_c8);
    if ((pauStack_e0 <= *local_d8[0] + 5) &&
       (iVar8 = yaml_string_extend((yaml_char_t **)local_e8,(yaml_char_t **)local_d8,
                                   (yaml_char_t **)(local_e8 + 8)), iVar8 == 0)) goto LAB_00113ad4;
    pbVar18 = (parser->buffer).pointer;
    bVar15 = *pbVar18;
    pauVar10 = local_d8[0];
    if (bVar15 < 0xc2) {
      if (bVar15 == 10) {
LAB_001138e4:
        local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
        goto LAB_001138ed;
      }
      if (bVar15 != 0xd) goto LAB_001134ee;
      if (pbVar18[1] != 10) goto LAB_001138e4;
      local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
LAB_0011362b:
      (*pauVar10)[0] = 10;
      ppyVar24 = &(parser->buffer).pointer;
      *ppyVar24 = *ppyVar24 + 2;
      (parser->mark).column = 0;
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).line = (parser->mark).line + 1;
      sVar13 = parser->unread - 2;
    }
    else {
      if ((bVar15 != 0xc2) || (pbVar18[1] != 0x85)) goto LAB_001134ee;
      local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
LAB_00113911:
      (*pauVar10)[0] = 10;
      ppyVar24 = &(parser->buffer).pointer;
      *ppyVar24 = *ppyVar24 + 2;
LAB_0011391c:
      (parser->mark).column = 0;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).line = (parser->mark).line + 1;
      sVar13 = parser->unread - 1;
    }
    parser->unread = sVar13;
  }
  else {
    if (bVar15 != 0x20) {
      if (((bVar15 != 0xe2) && (bVar15 == 0xc2)) && (pbVar18[1] == 0x85)) goto LAB_00113511;
LAB_00113964:
      if (bVar23) {
        if (*(yaml_char_t *)local_e8 == '\n') {
          if (*(yaml_char_t *)local_108 == '\0') {
            if ((pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) &&
               (iVar8 = yaml_string_extend((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                           (yaml_char_t **)&pauStack_120), iVar8 == 0))
            goto LAB_00113ad4;
            (*apauStack_118[0])[0] = 0x20;
            apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
          }
          else {
            iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                     (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_108,
                                     local_f8,(yaml_char_t **)(local_108 + 8));
            if (iVar8 == 0) goto LAB_00113ad4;
            local_f8[0] = (yaml_char_t *)local_108;
            memset((void *)local_108,0,(long)pauStack_100 - (long)local_108);
          }
          local_d8[0] = (undefined1 (*) [16])local_e8;
          ppyVar24 = (yaml_char_t **)(local_e8 + 8);
          __s = local_e8;
        }
        else {
          iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                   (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_e8,
                                   (yaml_char_t **)local_d8,(yaml_char_t **)(local_e8 + 8));
          if (iVar8 == 0) goto LAB_00113ad4;
          local_d8[0] = (undefined1 (*) [16])local_e8;
          ppyVar24 = (yaml_char_t **)(local_108 + 8);
          iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                   (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_108,local_f8,
                                   ppyVar24);
          if (iVar8 == 0) goto LAB_00113ad4;
          local_d8[0] = (undefined1 (*) [16])local_e8;
          memset((void *)local_e8,0,(long)pauStack_e0 - (long)local_e8);
          local_f8[0] = (yaml_char_t *)local_108;
          __s = local_108;
        }
      }
      else {
        ppyVar24 = (yaml_char_t **)(local_c8 + 8);
        iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                 (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_c8,
                                 (yaml_char_t **)&local_b8,ppyVar24);
        if (iVar8 == 0) goto LAB_00113ad4;
        local_b8 = (undefined1 (*) [16])local_c8;
        __s = local_c8;
      }
      memset((void *)__s,0,(long)*ppyVar24 - (long)__s);
      uVar11 = parser->unread;
      goto LAB_0011288b;
    }
LAB_00113485:
    if (!bVar23) {
      if (*local_b8 + 5 < pauStack_c0) {
LAB_001137d9:
        pauVar10 = local_b8;
        (parser->buffer).pointer = pbVar18 + 1;
        local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
        (*pauVar10)[0] = *pbVar18;
      }
      else {
        iVar8 = yaml_string_extend((yaml_char_t **)local_c8,(yaml_char_t **)&local_b8,
                                   (yaml_char_t **)(local_c8 + 8));
        if (iVar8 == 0) goto LAB_00113ad4;
        pbVar18 = (parser->buffer).pointer;
        bVar15 = *pbVar18;
        if (-1 < (char)bVar15) goto LAB_001137d9;
        if ((bVar15 & 0xe0) == 0xc0) {
LAB_001137b5:
          (parser->buffer).pointer = pbVar18 + 1;
          (*local_b8)[0] = *pbVar18;
          pbVar18 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_001137d9;
        }
        if ((bVar15 & 0xf0) == 0xe0) {
LAB_00113791:
          (parser->buffer).pointer = pbVar18 + 1;
          (*local_b8)[0] = *pbVar18;
          pbVar18 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_001137b5;
        }
        if ((bVar15 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar18 + 1;
          (*local_b8)[0] = *pbVar18;
          pbVar18 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_00113791;
        }
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar13 = parser->unread - 1;
      parser->unread = sVar13;
      bVar23 = false;
      goto joined_r0x00113266;
    }
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    parser->unread = parser->unread - 1;
    bVar15 = *pbVar18;
    lVar17 = 1;
    if ((((char)bVar15 < '\0') && (lVar17 = 2, (bVar15 & 0xe0) != 0xc0)) &&
       (lVar17 = 3, (bVar15 & 0xf0) != 0xe0)) {
      lVar17 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar18 + lVar17;
LAB_001134ee:
    sVar13 = parser->unread;
  }
  bVar23 = true;
  goto joined_r0x00113266;
}

Assistant:

static int
yaml_parser_fetch_flow_scalar(yaml_parser_t *parser, int single)
{
    yaml_token_t token;

    /* A plain scalar could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a flow scalar. */

    parser->simple_key_allowed = 0;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_flow_scalar(parser, &token, single))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}